

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<duckdb::DataPointer>
          (Serializer *this,vector<duckdb::DataPointer,_true> *vec)

{
  pointer pDVar1;
  DataPointer *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,((long)(vec->
                         super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
                         super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->
                         super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
                         super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  pDVar1 = (vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
           super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (vec->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
                 super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pDVar1; this_00 = this_00 + 1)
  {
    (*this->_vptr_Serializer[6])(this);
    DataPointer::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}